

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::printSymbolTable(Assembler *this)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ostream *poVar4;
  reference ppVar5;
  undefined8 uVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>
  *entry;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
  *__range1;
  ostream local_210 [8];
  ofstream file;
  Assembler *this_local;
  
  std::ofstream::ofstream(local_210,(string *)&this->outputFileName,_S_out);
  poVar4 = std::operator<<(local_210,"Symbol table:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_210,"Value\tType\tSection\t\tName\t\tId\t\tSize");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
           ::begin(&this->symbolTable);
  entry = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
             ::end(&this->symbolTable);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&entry);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
             ::operator*(&__end1);
    uVar6 = std::ostream::operator<<(local_210,std::dec);
    _Var2 = std::setfill<char>('0');
    poVar4 = std::operator<<(uVar6,_Var2._M_c);
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ppVar5->second).value);
    std::operator<<(poVar4,"\t");
    if (((ppVar5->second).isGlobal & 1U) == 0) {
      std::operator<<(local_210,"l\t");
    }
    else {
      std::operator<<(local_210,"g\t");
    }
    poVar4 = (ostream *)std::ostream::operator<<(local_210,std::dec);
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ppVar5->second).section);
    poVar4 = std::operator<<(poVar4,"\t");
    _Var2 = std::setfill<char>(' ');
    poVar4 = std::operator<<(poVar4,_Var2._M_c);
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,(string *)&ppVar5->second);
    poVar4 = std::operator<<(poVar4,"\t");
    _Var2 = std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,_Var2._M_c);
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)(ushort)(ppVar5->second).id);
    std::operator<<(poVar4,"\t");
    poVar4 = (ostream *)std::ostream::operator<<(local_210,std::dec);
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    _Var2 = std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,_Var2._M_c);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ppVar5->second).size);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
    ::operator++(&__end1);
  }
  poVar4 = (ostream *)std::ostream::operator<<(local_210,std::dec);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void Assembler::printSymbolTable() {
    ofstream file(this->outputFileName);

    file << "Symbol table:" << endl;
    file << "Value\tType\tSection\t\tName\t\tId\t\tSize" << endl;
    for (auto &entry: symbolTable) {
        file << dec << setfill('0') << setw(8) << entry.second.value << "\t";
        //file << hex << setfill('0') << setw(8) << (0xffff & entry.second.value) << "\t";

        if (entry.second.isGlobal == false)
            file << "l\t";
        else {
            file << "g\t";
        }
        file << dec << setw(8) << entry.second.section << "\t" << setfill(' ') << setw(8) << entry.second.symbolName
             << "\t"
             << setfill('0')
             << setw(8) << (0xffff & entry.second.id) << "\t";
        file << dec << setw(8) << setfill('0') << entry.second.size << endl;
    }
    file << dec << endl;


}